

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcInse.c
# Opt level: O0

void Gia_ManInseFindStarting(Gia_Man_t *p,int iPat,Vec_Int_t *vInit,Vec_Int_t *vInputs)

{
  int iVar1;
  int iVar2;
  word *pwVar3;
  bool bVar4;
  int local_48;
  int local_44;
  int k;
  int i;
  word *pData1;
  word *pData0;
  Gia_Obj_t *pObj;
  Vec_Int_t *vInputs_local;
  Vec_Int_t *vInit_local;
  int iPat_local;
  Gia_Man_t *p_local;
  
  Vec_IntClear(vInit);
  local_48 = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar4 = false;
    if (local_48 < iVar1) {
      iVar1 = Gia_ManPoNum(p);
      pData0 = (word *)Gia_ManCo(p,iVar1 + local_48);
      bVar4 = (Gia_Obj_t *)pData0 != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    iVar1 = Gia_ObjId(p,(Gia_Obj_t *)pData0);
    pwVar3 = Gia_ParTestObj(p,iVar1);
    iVar1 = p->iData;
    for (local_44 = 0; local_44 < p->iData; local_44 = local_44 + 1) {
      if ((pwVar3[local_44] & (pwVar3 + iVar1)[local_44]) != 0) {
        __assert_fail("(pData0[i] & pData1[i]) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcInse.c"
                      ,0xd1,
                      "void Gia_ManInseFindStarting(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *)");
      }
    }
    iVar2 = Abc_InfoHasBit((uint *)pwVar3,iPat);
    if (iVar2 == 0) {
      iVar1 = Abc_InfoHasBit((uint *)(pwVar3 + iVar1),iPat);
      if (iVar1 == 0) {
        Vec_IntPush(vInit,2);
      }
      else {
        Vec_IntPush(vInit,1);
      }
    }
    else {
      Vec_IntPush(vInit,0);
    }
    local_48 = local_48 + 1;
  }
  local_48 = 0;
  while( true ) {
    iVar1 = Gia_ManPiNum(p);
    bVar4 = false;
    if (local_48 < iVar1) {
      pData0 = (word *)Gia_ManCi(p,local_48);
      bVar4 = (Gia_Obj_t *)pData0 != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    iVar1 = Gia_ObjId(p,(Gia_Obj_t *)pData0);
    pwVar3 = Gia_ParTestObj(p,iVar1);
    iVar1 = p->iData;
    for (local_44 = 0; local_44 < p->iData; local_44 = local_44 + 1) {
      if ((pwVar3[local_44] & (pwVar3 + iVar1)[local_44]) != 0) {
        __assert_fail("(pData0[i] & pData1[i]) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcInse.c"
                      ,0xde,
                      "void Gia_ManInseFindStarting(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *)");
      }
    }
    iVar2 = Abc_InfoHasBit((uint *)pwVar3,iPat);
    if (iVar2 == 0) {
      iVar1 = Abc_InfoHasBit((uint *)(pwVar3 + iVar1),iPat);
      if (iVar1 == 0) {
        Vec_IntPush(vInputs,2);
      }
      else {
        Vec_IntPush(vInputs,1);
      }
    }
    else {
      Vec_IntPush(vInputs,0);
    }
    local_48 = local_48 + 1;
  }
  return;
}

Assistant:

void Gia_ManInseFindStarting( Gia_Man_t * p, int iPat, Vec_Int_t * vInit, Vec_Int_t * vInputs )
{
    Gia_Obj_t * pObj;
    word * pData0, * pData1;
    int i, k;
    Vec_IntClear( vInit );
    Gia_ManForEachRi( p, pObj, k )
    {
        pData0 = Gia_ParTestObj( p, Gia_ObjId(p, pObj) );
        pData1 = pData0 + p->iData;
        for ( i = 0; i < p->iData; i++ )
            assert( (pData0[i] & pData1[i]) == 0 );
        if ( Abc_InfoHasBit( (unsigned *)pData0, iPat ) )
            Vec_IntPush( vInit, 0 );
        else if ( Abc_InfoHasBit( (unsigned *)pData1, iPat ) )
            Vec_IntPush( vInit, 1 );
        else 
            Vec_IntPush( vInit, 2 );
    }
    Gia_ManForEachPi( p, pObj, k )
    {
        pData0 = Gia_ParTestObj( p, Gia_ObjId(p, pObj) );
        pData1 = pData0 + p->iData;
        for ( i = 0; i < p->iData; i++ )
            assert( (pData0[i] & pData1[i]) == 0 );
        if ( Abc_InfoHasBit( (unsigned *)pData0, iPat ) )
            Vec_IntPush( vInputs, 0 );
        else if ( Abc_InfoHasBit( (unsigned *)pData1, iPat ) )
            Vec_IntPush( vInputs, 1 );
        else 
            Vec_IntPush( vInputs, 2 );
    }
}